

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::copy_physical_device_features
          (Impl *this,void *device_pnext,ScratchAllocator *alloc,VkPhysicalDeviceFeatures2 **out_pdf
          )

{
  bool bVar1;
  VkPhysicalDeviceFeatures2 *pVVar2;
  VkPhysicalDeviceFeatures2 *features;
  VkPhysicalDeviceFeatures2 *pdf;
  VkPhysicalDeviceFeatures2 **out_pdf_local;
  ScratchAllocator *alloc_local;
  void *device_pnext_local;
  Impl *this_local;
  
  pVVar2 = find_pnext<VkPhysicalDeviceFeatures2>
                     (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2,device_pnext);
  if (pVVar2 == (VkPhysicalDeviceFeatures2 *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pVVar2 = copy<VkPhysicalDeviceFeatures2>(this,pVVar2,1,alloc);
    pVVar2->pNext = (void *)0x0;
    bVar1 = copy_pnext_chain_pdf2(this,device_pnext,alloc,&pVVar2->pNext);
    if (bVar1) {
      *out_pdf = pVVar2;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool StateRecorder::Impl::copy_physical_device_features(const void *device_pnext,
                                                        ScratchAllocator &alloc,
                                                        VkPhysicalDeviceFeatures2 **out_pdf)
{
	// Reorder so that PDF2 comes first in the chain.
	// Caller guarantees that PDF2 is part of the device_pnext.
	// If original application did not have PDF2, just synthesize one based on pEnabledFeatures instead.
	const auto *pdf = find_pnext<VkPhysicalDeviceFeatures2>(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2,
	                                                        device_pnext);

	if (!pdf)
		return false;

	auto *features = copy(pdf, 1, alloc);
	features->pNext = nullptr;

	if (!copy_pnext_chain_pdf2(device_pnext, alloc, &features->pNext))
		return false;

	*out_pdf = features;
	return true;
}